

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

QUrl QUrl::fromEncoded(QByteArrayView input,ParsingMode mode)

{
  storage_type *in_RCX;
  undefined4 in_register_00000014;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  ba.m_size._4_4_ = in_register_00000014;
  ba.m_size._0_4_ = mode;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  ba.m_data = in_RCX;
  QString::fromUtf8((QString *)&QStack_38,(QString *)input.m_data,ba);
  QUrl((QUrl *)input.m_size,(QString *)&QStack_38,(ParsingMode)in_RCX);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QUrl)(QUrlPrivate *)input.m_size;
  }
  __stack_chk_fail();
}

Assistant:

QUrl QUrl::fromEncoded(QByteArrayView input, ParsingMode mode)
{
    return QUrl(QString::fromUtf8(input), mode);
}